

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromAigPhase(Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *p;
  int iVar7;
  int iVar8;
  Abc_Ntk_t *pAVar9;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x256,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  iVar8 = pMan->nBarBufs;
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = iVar8;
  pAVar2 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar2;
  for (iVar8 = 0; iVar1 = pMan->nRegs, iVar8 < pMan->nObjs[2] - iVar1; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(pMan->vCis,iVar8);
    pAVar2 = Abc_NtkCreatePi(pNtk);
    *(Abc_Obj_t **)((long)pvVar3 + 0x28) = pAVar2;
  }
  for (iVar8 = 0; iVar7 = pMan->nObjs[3] - iVar1, iVar8 < iVar7; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(pMan->vCos,iVar8);
    pAVar2 = Abc_NtkCreatePo(pNtk);
    *(Abc_Obj_t **)((long)pvVar3 + 0x28) = pAVar2;
    iVar1 = pMan->nRegs;
  }
  if (pNtk->vCis->nSize == pMan->nObjs[2] - iVar1) {
    if (pNtk->vCos->nSize == iVar7) {
      for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
        pAVar4 = Aig_ManLi(pMan,iVar8);
        pAVar5 = Aig_ManLo(pMan,iVar8);
        pAVar2 = Abc_NtkCreateLatch(pNtk);
        pAVar6 = Abc_NtkCreateBi(pNtk);
        (pAVar4->field_5).pData = pAVar6;
        pAVar6 = Abc_NtkCreateBo(pNtk);
        (pAVar5->field_5).pData = pAVar6;
        Abc_ObjAddFanin(pAVar2,(Abc_Obj_t *)(pAVar4->field_5).pData);
        Abc_ObjAddFanin((Abc_Obj_t *)(pAVar5->field_5).pData,pAVar2);
        Abc_LatchSetInit0(pAVar2);
        iVar1 = pMan->nRegs;
      }
      p = Aig_ManDfs(pMan,1);
      for (iVar8 = 0; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar8);
        if ((*(uint *)&pAVar4->field_0x18 & 7) == 4) {
          pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar4);
        }
        else {
          pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar4);
          pAVar6 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar4);
          pAVar2 = Abc_AigAnd(pMan_00,pAVar2,pAVar6);
        }
        (pAVar4->field_5).pData = pAVar2;
      }
      Vec_PtrFree(p);
      for (iVar8 = 0; iVar8 < pMan->vCos->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,iVar8);
        pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar4);
        pAVar6 = Abc_NtkCo(pNtk,iVar8);
        Abc_ObjAddFanin(pAVar6,pAVar2);
      }
      Abc_NtkAddDummyPiNames(pNtk);
      Abc_NtkAddDummyPoNames(pNtk);
      Abc_NtkAddDummyBoxNames(pNtk);
      pAVar9 = pNtk;
      iVar8 = Abc_NtkCheck(pNtk);
      if (iVar8 == 0) {
        Abc_Print((int)pAVar9,"Abc_NtkFromAigPhase(): Network check has failed.\n");
      }
      return pNtk;
    }
    __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x26e,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x26d,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromAigPhase( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i; 
    assert( pMan->nAsserts == 0 );
    // perform strashing
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // duplicate the name and the spec
//    pNtkNew->pName = Extra_UtilStrsav(pMan->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    // create PIs
    Aig_ManForEachPiSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePi( pNtkNew );
//        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        pObj->pData = pObjNew;
    }
    // create POs
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePo( pNtkNew );
//        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        pObj->pData = pObjNew;
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
//        Abc_ObjAssignName( (Abc_Obj_t *)pObjLi->pData, Abc_ObjName((Abc_Obj_t *)pObjLi->pData), NULL );
//        Abc_ObjAssignName( (Abc_Obj_t *)pObjLo->pData, Abc_ObjName((Abc_Obj_t *)pObjLo->pData), NULL );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }

    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    Abc_NtkAddDummyBoxNames( pNtkNew );

    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromAigPhase(): Network check has failed.\n" );
    return pNtkNew;
}